

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::compiler::java::(anonymous_namespace)::SetPrimitiveVariables(google::protobuf::FieldDescriptor_const*,int,int,google::protobuf::compiler::java::FieldGeneratorInfo_const*,google::protobuf::compiler::java::ClassNameResolver*,absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>*,google::protobuf::compiler::java::Context*)::__3,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr,type args)

{
  AlphaNum *c;
  AlphaNum local_b0;
  AlphaNum local_80;
  VoidPtr local_50;
  size_t local_48;
  
  c = (AlphaNum *)args._M_str;
  local_48 = args._M_len;
  local_80.piece_._M_len = 4;
  local_80.piece_._M_str = " != ";
  local_50 = ptr;
  lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_b0,*(void **)this,(char (*) [8])0x1145dd2);
  local_b0.piece_._M_len = *(size_t *)(local_b0.piece_._M_str + 0x18);
  local_b0.piece_._M_str = *(char **)(local_b0.piece_._M_str + 0x10);
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_50,&local_80,&local_b0,c);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}